

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool __thiscall QApplicationPrivate::windowNeverBlocked(QApplicationPrivate *this,QWindow *window)

{
  QWidget *this_00;
  QWindow *pQVar1;
  bool bVar2;
  
  this_00 = QApplication::activePopupWidget();
  if (this_00 == (QWidget *)0x0) {
    pQVar1 = (QWindow *)0x0;
  }
  else {
    pQVar1 = QWidget::windowHandle(this_00);
  }
  if (pQVar1 == window) {
    bVar2 = true;
  }
  else if (pQVar1 == (QWindow *)0x0) {
    bVar2 = *(char *)(*(long *)(window + 8) + 0x7c) == '\t';
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QApplicationPrivate::windowNeverBlocked(QWindow *window) const
{
    QWidget *popupWidget = QApplication::activePopupWidget();
    QWindow *popupWindow = popupWidget ? popupWidget->windowHandle() : nullptr;
    return popupWindow == window || (!popupWindow && QWindowPrivate::get(window)->isPopup());
}